

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O1

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *this;
  pointer pcVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  undefined8 in_RAX;
  undefined8 uVar7;
  string *psVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  pointer inName;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string srcPath;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  char *local_90;
  undefined4 local_84;
  undefined8 local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_b8.field_2;
  if (inName == pbVar2) {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    bVar5 = 0;
  }
  else {
    this = status->Makefile;
    local_38 = (string *)&status->Error;
    local_84 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_80 = 0;
    do {
      uVar7 = std::__cxx11::string::compare((char *)inName);
      if ((int)uVar7 == 0) {
        local_80 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)inName);
        if (iVar6 != 0) {
          psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          pcVar3 = (psVar8->_M_dataplus)._M_p;
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar3,pcVar3 + psVar8->_M_string_length);
          std::__cxx11::string::append((char *)&local_b8);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b8,(ulong)(inName->_M_dataplus)._M_p);
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_58.field_2._M_allocated_capacity = *psVar11;
            local_58.field_2._8_8_ = plVar9[3];
          }
          else {
            local_58.field_2._M_allocated_capacity = *psVar11;
            local_58._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_58._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          bVar4 = cmsys::SystemTools::FileIsDirectory(&local_58);
          if (bVar4) {
            psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            pcVar3 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar3,pcVar3 + psVar8->_M_string_length);
            std::__cxx11::string::append((char *)&local_d8);
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_d8,(ulong)(inName->_M_dataplus)._M_p);
            psVar11 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_b8.field_2._M_allocated_capacity = *psVar11;
              local_b8.field_2._8_8_ = puVar10[3];
              local_b8._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar11;
              local_b8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_b8._M_string_length = puVar10[1];
            *puVar10 = psVar11;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            cmMakefile::AddSubDirectory
                      (this,&local_58,&local_b8,(bool)((byte)local_80 & 1),false,false);
LAB_00359846:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar1) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar4 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar4) {
              psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              pcVar3 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,pcVar3,pcVar3 + psVar8->_M_string_length);
              std::__cxx11::string::append((char *)&local_d8);
              cmsys::SystemTools::GetFilenameName(&local_78,inName);
              uVar7 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar7 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar7 < local_78._M_string_length + local_d8._M_string_length) {
                uVar7 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p != &local_78.field_2) {
                  uVar7 = local_78.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar7 < local_78._M_string_length + local_d8._M_string_length)
                goto LAB_003596ab;
                puVar10 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_78,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p
                                    );
              }
              else {
LAB_003596ab:
                puVar10 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_d8,(ulong)local_78._M_dataplus._M_p);
              }
              psVar11 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_b8.field_2._M_allocated_capacity = *psVar11;
                local_b8.field_2._8_8_ = puVar10[3];
                local_b8._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar11;
                local_b8._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_b8._M_string_length = puVar10[1];
              *puVar10 = psVar11;
              puVar10[1] = 0;
              *(undefined1 *)psVar11 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              cmMakefile::AddSubDirectory
                        (this,inName,&local_b8,(bool)((byte)local_80 & 1),false,false);
              goto LAB_00359846;
            }
            local_b8.field_2._8_8_ = (inName->_M_dataplus)._M_p;
            local_b8.field_2._M_allocated_capacity = inName->_M_string_length;
            local_b8._M_dataplus._M_p = (pointer)0x26;
            local_b8._M_string_length = 0x7144b8;
            local_98 = 0x10;
            local_90 = " does not exist.";
            views._M_len = 3;
            views._M_array = (iterator)&local_b8;
            cmCatViews_abi_cxx11_(&local_d8,views);
            std::__cxx11::string::_M_assign(local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            local_84 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != pbVar2);
    bVar5 = (byte)local_84;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}